

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

int on_headers_complete(http_parser *parser)

{
  uint64_t *client;
  code *pcVar1;
  void *pvVar2;
  int iVar3;
  cio_error cVar4;
  char *msg;
  
  client = &parser[-0x1b].content_length;
  parser[-2].field_0x2 = 1;
  iVar3 = http_should_keep_alive(parser);
  *(bool *)(parser + -2) = iVar3 == 1;
  if ((iVar3 != 1) && ((char)parser[-2].content_length == '\x01')) {
    mark_to_be_closed((cio_http_client *)client);
  }
  parser[-0x14].content_length = parser->content_length;
  cVar4 = cio_timer_cancel((cio_timer *)&parser[-7].data);
  if (cVar4 == CIO_SUCCESS) {
    if ((((char)parser[-2].content_length == '\0') &&
        (pcVar1 = *(code **)((long)parser[-0x14].data + 0x48), pcVar1 != (code *)0x0)) &&
       (iVar3 = (*pcVar1)(client), iVar3 != 0)) {
      return iVar3;
    }
    cVar4 = cio_timer_expires_from_now
                      ((cio_timer *)&parser[-7].data,*(uint64_t *)((long)parser->data + 0x98),
                       client_timeout_handler,client);
    if (cVar4 == CIO_SUCCESS) {
      pvVar2 = (void *)parser[-0x14].content_length;
      if (pvVar2 == (void *)0x0) {
        return 0;
      }
      *(code **)&parser[-2].http_major = finish_bytes;
      parser[-3].data = pvVar2;
      return 0;
    }
    msg = "Arming of body read timer failed!";
  }
  else {
    msg = "Cancelling read timer in on_headers_complete failed, maybe not armed?";
  }
  handle_server_error((cio_http_client *)client,msg);
  return 0;
}

Assistant:

static int on_headers_complete(http_parser *parser)
{
	struct cio_http_client *client = cio_container_of(parser, struct cio_http_client, parser);
	client->http_private.headers_complete = true;
	client->http_private.should_keepalive = (http_should_keep_alive(parser) == 1) ? true : false;
	if (cio_unlikely(!client->http_private.should_keepalive && client->http_private.response_fired)) {
		mark_to_be_closed(client);
	}

	if ((parser->content_length > SIZE_MAX) && (parser->content_length != ULLONG_MAX)) {
		handle_server_error(client, "Content-Length is too large to handle!");
		return 0;
	}

	client->content_length = (size_t)parser->content_length;

	enum cio_error err = cio_timer_cancel(&client->http_private.request_timer);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_server_error(client, "Cancelling read timer in on_headers_complete failed, maybe not armed?");
		return 0;
	}

	if ((!client->http_private.response_fired) && client->current_handler->on_headers_complete) {
		int ret = client->current_handler->on_headers_complete(client);
		if (cio_unlikely(ret != CIO_HTTP_CB_SUCCESS)) {
			return ret;
		}
	}

	const struct cio_http_server *server = cio_http_client_get_server(client);
	err = cio_timer_expires_from_now(&client->http_private.request_timer, server->read_body_timeout_ns, client_timeout_handler, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_server_error(client, "Arming of body read timer failed!");
		return 0;
	}

	if (client->content_length > 0) {
		client->http_private.finish_func = finish_bytes;
		client->http_private.remaining_content_length = client->content_length;
	}

	return 0;
}